

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManBfsForCrossCut(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Vec_t *p_01;
  Vec_Ptr_t *p_02;
  Gia_Obj_t *pObj_00;
  undefined4 local_38;
  undefined4 local_34;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Ptr_t *vObjs;
  Vec_Vec_t *vLevels;
  Vec_Int_t *vNodes;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  p_01 = Gia_ManLevelize(p);
  for (local_34 = 0; iVar1 = Vec_VecSize(p_01), local_34 < iVar1; local_34 = local_34 + 1) {
    p_02 = Vec_VecEntry(p_01,local_34);
    for (local_38 = 0; iVar1 = Vec_PtrSize(p_02), local_38 < iVar1; local_38 = local_38 + 1) {
      pObj_00 = (Gia_Obj_t *)Vec_PtrEntry(p_02,local_38);
      iVar1 = Gia_ObjId(p,pObj_00);
      Vec_IntPush(p_00,iVar1);
    }
  }
  Vec_VecFree(p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManBfsForCrossCut( Gia_Man_t * p )
{
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Vec_Vec_t * vLevels = Gia_ManLevelize( p );
    Vec_Ptr_t * vObjs;
    Gia_Obj_t * pObj;
    int i, k;
    Vec_VecForEachLevel( vLevels, vObjs, i )
        Vec_PtrForEachEntry( Gia_Obj_t *, vObjs, pObj, k )
            Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    Vec_VecFree( vLevels );
    return vNodes;
}